

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

error_code __thiscall
gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
set_option_linger(AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *this
                 ,bool b,uint16_t timeout,error_code *ec)

{
  AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *in_RDI;
  error_code eVar1;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  
  asio::detail::socket_option::linger<1,_13>::linger
            ((linger<1,_13> *)in_RDI,SUB41((uint)in_stack_ffffffffffffffbc >> 0x18,0),
             in_stack_ffffffffffffffb8);
  eVar1 = AsioSocket<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>::
          set_option<asio::detail::socket_option::linger<1,13>>
                    (in_RDI,(linger<1,_13> *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (error_code *)0x6fe40a);
  eVar1._4_4_ = 0;
  return eVar1;
}

Assistant:

std::error_code
        set_option_linger(bool b, uint16_t timeout, std::error_code& ec)
    {
        return set_option(asio::socket_base::linger(b, timeout), ec);
    }